

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_can_test.cpp
# Opt level: O0

ssize_t __thiscall SocketCAN::Writer::send(Writer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ulong uVar1;
  ulong __n_00;
  size_t __n_01;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  ulong local_58;
  size_t ii;
  __u8 *srcDataPtr;
  size_t lastDataFrameSize;
  size_t fullDataFrameNumb;
  size_t maxDataLen;
  can_frame frame;
  size_t size_local;
  __u8 *data_local;
  Writer *this_local;
  
  __n_01 = CONCAT44(in_register_00000034,__fd);
  frame.data = (__u8  [8])__buf;
  memset(&maxDataLen,0,0x10);
  uVar1 = (ulong)frame.data >> 3;
  __n_00 = (ulong)frame.data & 7;
  maxDataLen._0_4_ = this->_id;
  maxDataLen._4_1_ = 8;
  __buf_00 = extraout_RDX;
  ii = __n_01;
  for (local_58 = 0; local_58 < uVar1; local_58 = local_58 + 1) {
    frame._0_8_ = *(undefined8 *)ii;
    Socket::write(&this->_socket,(int)&maxDataLen,__buf_00,__n_01);
    ii = ii + 8;
    __buf_00 = extraout_RDX_00;
  }
  if (__n_00 != 0) {
    maxDataLen._4_1_ = (undefined1)__n_00;
    memcpy(&frame,(void *)ii,__n_00);
    local_58 = Socket::write(&this->_socket,(int)&maxDataLen,__buf_01,__n_01);
  }
  return local_58;
}

Assistant:

void send(const __u8* data, size_t size) {
    struct can_frame frame{0};
    const size_t     maxDataLen = CAN_MAX_DLEN;

    const size_t fullDataFrameNumb = size/CAN_MAX_DLEN;
    const size_t lastDataFrameSize = size%CAN_MAX_DLEN;
    const __u8* srcDataPtr = data;

    frame.can_id  = _id;
    frame.can_dlc = static_cast<__u8>(maxDataLen);
    for (size_t ii = 0; ii < fullDataFrameNumb; ++ii) {
      memcpy(frame.data, srcDataPtr, maxDataLen);
      _socket.write(&frame);
      srcDataPtr += maxDataLen;
    }

    if (lastDataFrameSize > 0) {
      frame.can_dlc = static_cast<__u8>(lastDataFrameSize);
      memcpy(frame.data, srcDataPtr, lastDataFrameSize);
      _socket.write(&frame);
    }

  }